

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_String *in_value)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_String *in_value_local;
  Am_Value *this_local;
  
  bVar1 = Am_Type_Is_Ref_Counted(this->type);
  if ((bVar1) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  this->type = 0x8008;
  pAVar2 = Am_String::operator_cast_to_Am_Wrapper_(in_value);
  (this->value).wrapper_value = pAVar2;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(const Am_String &in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  type = Am_STRING;
  value.wrapper_value = in_value;
  return *this;
}